

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O3

bool __thiscall
crnd::crn_unpacker::unpack_dxn
          (crn_unpacker *this,uint8 **pDst,uint32 row_pitch_in_bytes,uint32 output_width,
          uint32 output_height)

{
  symbol_codec *this_00;
  vector<crnd::crn_unpacker::block_buffer_element> *this_01;
  uint uVar1;
  unsigned_short *puVar2;
  bool bVar3;
  byte bVar4;
  uint32 uVar5;
  uint uVar6;
  uint32 uVar7;
  crn_header *pcVar8;
  uint8 *puVar9;
  uint uVar10;
  uint uVar11;
  uint min_new_capacity;
  uint32 x;
  ulong uVar12;
  long lVar13;
  long lVar14;
  block_buffer_element *pbVar15;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  ulong local_a0;
  
  uVar1 = (this->m_alpha_endpoints).m_size;
  uVar10 = (this->m_block_buffer).m_size;
  min_new_capacity = output_width + 1 & 0xfffffffe;
  this_01 = &this->m_block_buffer;
  if (uVar10 < min_new_capacity) {
    if ((min_new_capacity <= (this->m_block_buffer).m_capacity) ||
       (bVar3 = elemental_vector::increase_capacity
                          ((elemental_vector *)this_01,min_new_capacity,
                           uVar10 + 1 == min_new_capacity,8,(object_mover)0x0), bVar3)) {
      (this->m_block_buffer).m_size = min_new_capacity;
    }
    else {
      (this->m_block_buffer).m_alloc_failed = true;
    }
  }
  pcVar8 = this->m_pHeader;
  if ((pcVar8->m_faces).m_buf[0] != '\0') {
    uVar10 = output_height + 1 & 0xfffffffe;
    this_00 = &this->m_codec;
    local_a0 = 0;
    local_c4 = 0;
    local_c0 = 0;
    local_bc = 0;
    do {
      if (uVar10 != 0) {
        puVar9 = pDst[local_a0];
        uVar11 = 0;
        do {
          if (min_new_capacity != 0) {
            bVar3 = uVar11 < output_height;
            lVar14 = 6;
            lVar13 = 0;
            uVar12 = 0;
            do {
              if (((uVar11 | (uint)uVar12) & 1) == 0) {
                local_bc = symbol_codec::decode(this_00,&this->m_reference_encoding_dm);
                pbVar15 = this_01->m_p + uVar12;
LAB_00115edd:
                bVar4 = (byte)local_bc & 3;
                pbVar15->endpoint_reference = (ushort)((byte)(local_bc >> 2) & 3);
                local_bc = (uint)(byte)((byte)local_bc >> 4);
              }
              else {
                pbVar15 = (block_buffer_element *)((long)this_01->m_p + lVar14 + -6);
                if ((uVar11 & 1) == 0) goto LAB_00115edd;
                bVar4 = (byte)this_01->m_p[uVar12].endpoint_reference;
              }
              if (bVar4 == 1) {
                pbVar15->alpha0_endpoint_index = (uint16)local_c4;
                pbVar15->alpha1_endpoint_index = (uint16)local_c0;
              }
              else if (bVar4 == 0) {
                uVar5 = symbol_codec::decode(this_00,this->m_endpoint_delta_dm + 1);
                uVar6 = 0;
                if (uVar1 <= uVar5 + local_c4) {
                  uVar6 = uVar1;
                }
                local_c4 = (uVar5 + local_c4) - uVar6;
                pbVar15->alpha0_endpoint_index = (uint16)local_c4;
                uVar5 = symbol_codec::decode(this_00,this->m_endpoint_delta_dm + 1);
                uVar6 = 0;
                if (uVar1 <= uVar5 + local_c0) {
                  uVar6 = uVar1;
                }
                local_c0 = (uVar5 + local_c0) - uVar6;
                pbVar15->alpha1_endpoint_index = (uint16)local_c0;
              }
              else {
                local_c4 = (uint)pbVar15->alpha0_endpoint_index;
                local_c0 = (uint)pbVar15->alpha1_endpoint_index;
              }
              bVar3 = (bool)(bVar3 & uVar12 < output_width);
              uVar5 = symbol_codec::decode(this_00,this->m_selector_delta_dm + 1);
              uVar7 = symbol_codec::decode(this_00,this->m_selector_delta_dm + 1);
              if (bVar3) {
                puVar2 = (this->m_alpha_selectors).m_p;
                *(uint *)(puVar9 + lVar14 * 2 + -0xc) =
                     CONCAT22(puVar2[uVar5 * 3],(this->m_alpha_endpoints).m_p[local_c4]);
                *(undefined4 *)(puVar9 + lVar14 * 2 + -8) =
                     *(undefined4 *)(puVar2 + (ulong)(uVar5 * 3) + 1);
                *(uint *)(puVar9 + lVar14 * 2 + -4) =
                     CONCAT22(puVar2[uVar7 * 3],(this->m_alpha_endpoints).m_p[local_c0]);
                *(undefined4 *)(puVar9 + lVar14 * 2) =
                     *(undefined4 *)(puVar2 + (ulong)(uVar7 * 3) + 1);
              }
              uVar12 = uVar12 + 1;
              lVar14 = lVar14 + 8;
              lVar13 = lVar13 + -0x10;
            } while (min_new_capacity != uVar12);
            puVar9 = puVar9 + -lVar13;
          }
          uVar11 = uVar11 + 1;
          puVar9 = puVar9 + (long)(int)((row_pitch_in_bytes >> 2) + min_new_capacity * -4) * 4;
        } while (uVar11 != uVar10);
        pcVar8 = this->m_pHeader;
      }
      local_a0 = local_a0 + 1;
    } while (local_a0 < (pcVar8->m_faces).m_buf[0]);
  }
  return true;
}

Assistant:

bool unpack_dxn(uint8** pDst, uint32 row_pitch_in_bytes, uint32 output_width, uint32 output_height) {
    const uint32 num_alpha_endpoints = m_alpha_endpoints.size();
    const uint32 width = (output_width + 1) & ~1;
    const uint32 height = (output_height + 1) & ~1;
    const int32 delta_pitch_in_dwords = (row_pitch_in_bytes >> 2) - (width << 2);

    if (m_block_buffer.size() < width)
      m_block_buffer.resize(width);

    uint32 alpha0_endpoint_index = 0;
    uint32 alpha1_endpoint_index = 0;
    uint8 reference_group = 0;

    for (uint32 f = 0; f < m_pHeader->m_faces; f++) {
      uint32* pData = (uint32*)pDst[f];
      for (uint32 y = 0; y < height; y++, pData += delta_pitch_in_dwords) {
        bool visible = y < output_height;
        for (uint32 x = 0; x < width; x++, pData += 4) {
          visible = visible && x < output_width;
          if (!(y & 1) && !(x & 1))
            reference_group = m_codec.decode(m_reference_encoding_dm);
          block_buffer_element &buffer = m_block_buffer[x];
          uint8 endpoint_reference;
          if (y & 1) {
            endpoint_reference = buffer.endpoint_reference;
          } else {
            endpoint_reference = reference_group & 3;
            reference_group >>= 2;
            buffer.endpoint_reference = reference_group & 3;
            reference_group >>= 2;
          }
          if (!endpoint_reference) {
            alpha0_endpoint_index += m_codec.decode(m_endpoint_delta_dm[1]);
            if (alpha0_endpoint_index >= num_alpha_endpoints)
              alpha0_endpoint_index -= num_alpha_endpoints;
            buffer.alpha0_endpoint_index = alpha0_endpoint_index;
            alpha1_endpoint_index += m_codec.decode(m_endpoint_delta_dm[1]);
            if (alpha1_endpoint_index >= num_alpha_endpoints)
              alpha1_endpoint_index -= num_alpha_endpoints;
            buffer.alpha1_endpoint_index = alpha1_endpoint_index;
          } else if (endpoint_reference == 1) {
            buffer.alpha0_endpoint_index = alpha0_endpoint_index;
            buffer.alpha1_endpoint_index = alpha1_endpoint_index;
          } else {
            alpha0_endpoint_index = buffer.alpha0_endpoint_index;
            alpha1_endpoint_index = buffer.alpha1_endpoint_index;
          }
          uint32 alpha0_selector_index = m_codec.decode(m_selector_delta_dm[1]);
          uint32 alpha1_selector_index = m_codec.decode(m_selector_delta_dm[1]);
          if (visible) {
            const uint16* pAlpha0_selectors = &m_alpha_selectors[alpha0_selector_index * 3];
            const uint16* pAlpha1_selectors = &m_alpha_selectors[alpha1_selector_index * 3];
            pData[0] = m_alpha_endpoints[alpha0_endpoint_index] | (pAlpha0_selectors[0] << 16);
            pData[1] = pAlpha0_selectors[1] | (pAlpha0_selectors[2] << 16);
            pData[2] = m_alpha_endpoints[alpha1_endpoint_index] | (pAlpha1_selectors[0] << 16);
            pData[3] = pAlpha1_selectors[1] | (pAlpha1_selectors[2] << 16);
          }
        }
      }
    }
    return true;
  }